

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O3

void __thiscall
ASTree::findNonRecursive
          (ASTree *this,string *basicString,vector<ASTree_*,_std::allocator<ASTree_*>_> *vector)

{
  size_t __n;
  pointer ppAVar1;
  ASTree *this_00;
  pointer pcVar2;
  int iVar3;
  pointer ppAVar4;
  string local_58;
  ASTree *local_38;
  
  __n = (this->root)._M_string_length;
  if ((__n == basicString->_M_string_length) &&
     ((__n == 0 ||
      (iVar3 = bcmp((this->root)._M_dataplus._M_p,(basicString->_M_dataplus)._M_p,__n), iVar3 == 0))
     )) {
    local_38 = this;
    std::vector<ASTree*,std::allocator<ASTree*>>::emplace_back<ASTree*>
              ((vector<ASTree*,std::allocator<ASTree*>> *)vector,&local_38);
  }
  else {
    ppAVar4 = (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppAVar1 = (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppAVar4 != ppAVar1) {
      do {
        this_00 = *ppAVar4;
        pcVar2 = (basicString->_M_dataplus)._M_p;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar2,pcVar2 + basicString->_M_string_length);
        findNonRecursive(this_00,&local_58,vector);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        ppAVar4 = ppAVar4 + 1;
      } while (ppAVar4 != ppAVar1);
    }
  }
  return;
}

Assistant:

void ASTree::findNonRecursive(string basicString, vector<ASTree *> &vector) {
    if (root == basicString) {
        vector.emplace_back(this);
        return;
    }
    for (auto child: subtrees) {
        child->findNonRecursive(basicString, vector);
    }
}